

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

string * google::
         MakeCheckOpString<__gnu_cxx::hash_set<int,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<int>>,__gnu_cxx::hash_set<int,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<int>>>
                   (hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                    *v1,hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *v2,char *exprtext)

{
  ostream *this;
  _Node *p_Var1;
  string *psVar2;
  uint uVar3;
  const_iterator local_50;
  CheckOpMessageBuilder local_40;
  CheckOpMessageBuilder comb;
  
  base::CheckOpMessageBuilder::CheckOpMessageBuilder(&local_40,exprtext);
  local_50 = __gnu_cxx::
             hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
             ::begin(&v1->_M_ht);
  if (local_50._M_cur != (_Node *)0x0) {
    uVar3 = 0;
    do {
      p_Var1 = local_50._M_cur;
      if (uVar3 != 0) {
        comb.stream_._7_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_40.stream_,(char *)((long)&comb.stream_ + 7),1);
        p_Var1 = local_50._M_cur;
      }
      std::ostream::operator<<(local_40.stream_,p_Var1->_M_val);
      __gnu_cxx::
      _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::operator++(&local_50);
    } while ((uVar3 < 99) && (uVar3 = uVar3 + 1, local_50._M_cur != (_Node *)0x0));
    if (local_50._M_cur != (_Node *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_40.stream_," ...",4);
    }
  }
  this = base::CheckOpMessageBuilder::ForVar2(&local_40);
  local_50 = __gnu_cxx::
             hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
             ::begin(&v2->_M_ht);
  if (local_50._M_cur != (_Node *)0x0) {
    uVar3 = 0;
    do {
      p_Var1 = local_50._M_cur;
      if (uVar3 != 0) {
        comb.stream_._7_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(this,(char *)((long)&comb.stream_ + 7),1)
        ;
        p_Var1 = local_50._M_cur;
      }
      std::ostream::operator<<(this,p_Var1->_M_val);
      __gnu_cxx::
      _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::operator++(&local_50);
    } while ((uVar3 < 99) && (uVar3 = uVar3 + 1, local_50._M_cur != (_Node *)0x0));
    if (local_50._M_cur != (_Node *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(this," ...",4);
    }
  }
  psVar2 = base::CheckOpMessageBuilder::NewString_abi_cxx11_(&local_40);
  base::CheckOpMessageBuilder::~CheckOpMessageBuilder(&local_40);
  return psVar2;
}

Assistant:

std::string* MakeCheckOpString(const T1& v1, const T2& v2, const char* exprtext) {
  base::CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}